

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O1

OPJ_BOOL opj_j2k_read_SQcd_SQcc
                   (opj_j2k_t *p_j2k,OPJ_UINT32 p_comp_no,OPJ_BYTE *p_header_data,
                   OPJ_UINT32 *p_header_size,opj_event_mgr_t *p_manager)

{
  opj_tccp_t *poVar1;
  ulong uVar2;
  long lVar3;
  opj_tccp_t *poVar4;
  opj_tcp_t *poVar5;
  OPJ_BOOL OVar6;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  OPJ_BYTE *p_buffer;
  OPJ_UINT32 l_tmp;
  uint local_50;
  uint local_4c;
  long local_48;
  opj_tccp_t *local_40;
  OPJ_UINT32 *local_38;
  
  if (p_header_data == (OPJ_BYTE *)0x0) {
    __assert_fail("p_header_data != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/j2k.c"
                  ,0x2757,
                  "OPJ_BOOL opj_j2k_read_SQcd_SQcc(opj_j2k_t *, OPJ_UINT32, OPJ_BYTE *, OPJ_UINT32 *, opj_event_mgr_t *)"
                 );
  }
  if ((p_j2k->m_specific_param).m_decoder.m_state == 0x10) {
    poVar5 = (p_j2k->m_cp).tcps + p_j2k->m_current_tile_number;
  }
  else {
    poVar5 = (p_j2k->m_specific_param).m_decoder.m_default_tcp;
  }
  if (p_comp_no < p_j2k->m_private_image->numcomps) {
    if (*p_header_size == 0) {
      OVar6 = 0;
      opj_event_msg(p_manager,1,"Error reading SQcd or SQcc element\n");
    }
    else {
      poVar1 = poVar5->tccps;
      uVar2 = (ulong)p_comp_no;
      local_48 = uVar2 * 0x438;
      *p_header_size = *p_header_size - 1;
      local_40 = poVar1;
      opj_read_bytes_LE(p_header_data,&local_50,1);
      local_4c = local_50 & 0x1f;
      poVar1[uVar2].qntsty = local_4c;
      poVar1[uVar2].numgbits = local_50 >> 5;
      if (local_4c != 1) {
        if (local_4c == 0) {
          local_4c = *p_header_size;
        }
        else {
          local_4c = *p_header_size >> 1;
        }
        if (0x61 < local_4c) {
          opj_event_msg(p_manager,2,
                        "While reading CCP_QNTSTY element inside QCD or QCC marker segment, number of subbands (%d) is greater to OPJ_J2K_MAXBANDS (%d). So we limit the number of elements stored to OPJ_J2K_MAXBANDS (%d) and skip the rest. \n"
                        ,(ulong)local_4c,0x61,0x61);
        }
      }
      poVar4 = local_40;
      lVar3 = local_48;
      p_buffer = p_header_data + 1;
      local_38 = p_header_size;
      if (poVar1[uVar2].qntsty == 0) {
        if (local_4c != 0) {
          uVar7 = (ulong)local_4c;
          uVar8 = 0;
          do {
            opj_read_bytes_LE(p_buffer + uVar8,&local_50,1);
            if (uVar8 < 0x61) {
              *(uint *)((long)&poVar4->stepsizes[uVar8].expn + lVar3) = local_50 >> 3;
              *(undefined4 *)((long)&poVar4->stepsizes[uVar8].mant + lVar3) = 0;
            }
            uVar8 = uVar8 + 1;
          } while (uVar7 != uVar8);
        }
        local_4c = *local_38 - local_4c;
      }
      else {
        if (local_4c != 0) {
          uVar8 = (ulong)local_4c;
          uVar7 = 0;
          do {
            opj_read_bytes_LE(p_buffer,&local_50,2);
            if (uVar7 < 0x61) {
              *(uint *)((long)&poVar4->stepsizes[uVar7].expn + lVar3) = local_50 >> 0xb;
              *(uint *)((long)&poVar4->stepsizes[uVar7].mant + lVar3) = local_50 & 0x7ff;
            }
            p_buffer = p_buffer + 2;
            uVar7 = uVar7 + 1;
          } while (uVar8 != uVar7);
        }
        local_4c = *local_38 + local_4c * -2;
      }
      *local_38 = local_4c;
      OVar6 = 1;
      if (poVar1[uVar2].qntsty == 1) {
        uVar7 = 0;
        do {
          iVar9 = poVar1[uVar2].stepsizes[0].expn - (int)((uVar7 & 0xffffffff) / 3);
          if (iVar9 < 1) {
            iVar9 = 0;
          }
          *(int *)((long)&local_40->stepsizes[uVar7 + 1].expn + local_48) = iVar9;
          *(OPJ_INT32 *)((long)&local_40->stepsizes[uVar7 + 1].mant + local_48) =
               poVar1[uVar2].stepsizes[0].mant;
          uVar7 = uVar7 + 1;
        } while (uVar7 != 0x60);
      }
    }
    return OVar6;
  }
  __assert_fail("p_comp_no < p_j2k->m_private_image->numcomps",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/j2k.c"
                ,0x2761,
                "OPJ_BOOL opj_j2k_read_SQcd_SQcc(opj_j2k_t *, OPJ_UINT32, OPJ_BYTE *, OPJ_UINT32 *, opj_event_mgr_t *)"
               );
}

Assistant:

static OPJ_BOOL opj_j2k_read_SQcd_SQcc(opj_j2k_t *p_j2k,
                                       OPJ_UINT32 p_comp_no,
                                       OPJ_BYTE* p_header_data,
                                       OPJ_UINT32 * p_header_size,
                                       opj_event_mgr_t * p_manager
                                      )
{
    /* loop*/
    OPJ_UINT32 l_band_no;
    opj_cp_t *l_cp = 00;
    opj_tcp_t *l_tcp = 00;
    opj_tccp_t *l_tccp = 00;
    OPJ_BYTE * l_current_ptr = 00;
    OPJ_UINT32 l_tmp, l_num_band;

    /* preconditions*/
    assert(p_j2k != 00);
    assert(p_manager != 00);
    assert(p_header_data != 00);

    l_cp = &(p_j2k->m_cp);
    /* come from tile part header or main header ?*/
    l_tcp = (p_j2k->m_specific_param.m_decoder.m_state == J2K_STATE_TPH)
            ?
            &l_cp->tcps[p_j2k->m_current_tile_number] :
            p_j2k->m_specific_param.m_decoder.m_default_tcp;

    /* precondition again*/
    assert(p_comp_no <  p_j2k->m_private_image->numcomps);

    l_tccp = &l_tcp->tccps[p_comp_no];
    l_current_ptr = p_header_data;

    if (*p_header_size < 1) {
        opj_event_msg(p_manager, EVT_ERROR, "Error reading SQcd or SQcc element\n");
        return OPJ_FALSE;
    }
    *p_header_size -= 1;

    opj_read_bytes(l_current_ptr, &l_tmp, 1);                       /* Sqcx */
    ++l_current_ptr;

    l_tccp->qntsty = l_tmp & 0x1f;
    l_tccp->numgbits = l_tmp >> 5;
    if (l_tccp->qntsty == J2K_CCP_QNTSTY_SIQNT) {
        l_num_band = 1;
    } else {
        l_num_band = (l_tccp->qntsty == J2K_CCP_QNTSTY_NOQNT) ?
                     (*p_header_size) :
                     (*p_header_size) / 2;

        if (l_num_band > OPJ_J2K_MAXBANDS) {
            opj_event_msg(p_manager, EVT_WARNING,
                          "While reading CCP_QNTSTY element inside QCD or QCC marker segment, "
                          "number of subbands (%d) is greater to OPJ_J2K_MAXBANDS (%d). So we limit the number of elements stored to "
                          "OPJ_J2K_MAXBANDS (%d) and skip the rest. \n", l_num_band, OPJ_J2K_MAXBANDS,
                          OPJ_J2K_MAXBANDS);
            /*return OPJ_FALSE;*/
        }
    }

#ifdef USE_JPWL
    if (l_cp->correct) {

        /* if JPWL is on, we check whether there are too many subbands */
        if (/*(l_num_band < 0) ||*/ (l_num_band >= OPJ_J2K_MAXBANDS)) {
            opj_event_msg(p_manager, JPWL_ASSUME ? EVT_WARNING : EVT_ERROR,
                          "JPWL: bad number of subbands in Sqcx (%d)\n",
                          l_num_band);
            if (!JPWL_ASSUME) {
                opj_event_msg(p_manager, EVT_ERROR, "JPWL: giving up\n");
                return OPJ_FALSE;
            }
            /* we try to correct */
            l_num_band = 1;
            opj_event_msg(p_manager, EVT_WARNING, "- trying to adjust them\n"
                          "- setting number of bands to %d => HYPOTHESIS!!!\n",
                          l_num_band);
        };

    };
#endif /* USE_JPWL */

    if (l_tccp->qntsty == J2K_CCP_QNTSTY_NOQNT) {
        for (l_band_no = 0; l_band_no < l_num_band; l_band_no++) {
            opj_read_bytes(l_current_ptr, &l_tmp, 1);                       /* SPqcx_i */
            ++l_current_ptr;
            if (l_band_no < OPJ_J2K_MAXBANDS) {
                l_tccp->stepsizes[l_band_no].expn = (OPJ_INT32)(l_tmp >> 3);
                l_tccp->stepsizes[l_band_no].mant = 0;
            }
        }
        *p_header_size = *p_header_size - l_num_band;
    } else {
        for (l_band_no = 0; l_band_no < l_num_band; l_band_no++) {
            opj_read_bytes(l_current_ptr, &l_tmp, 2);                       /* SPqcx_i */
            l_current_ptr += 2;
            if (l_band_no < OPJ_J2K_MAXBANDS) {
                l_tccp->stepsizes[l_band_no].expn = (OPJ_INT32)(l_tmp >> 11);
                l_tccp->stepsizes[l_band_no].mant = l_tmp & 0x7ff;
            }
        }
        *p_header_size = *p_header_size - 2 * l_num_band;
    }

    /* Add Antonin : if scalar_derived -> compute other stepsizes */
    if (l_tccp->qntsty == J2K_CCP_QNTSTY_SIQNT) {
        for (l_band_no = 1; l_band_no < OPJ_J2K_MAXBANDS; l_band_no++) {
            l_tccp->stepsizes[l_band_no].expn =
                ((OPJ_INT32)(l_tccp->stepsizes[0].expn) - (OPJ_INT32)((l_band_no - 1) / 3) > 0)
                ?
                (OPJ_INT32)(l_tccp->stepsizes[0].expn) - (OPJ_INT32)((l_band_no - 1) / 3) : 0;
            l_tccp->stepsizes[l_band_no].mant = l_tccp->stepsizes[0].mant;
        }
    }

    return OPJ_TRUE;
}